

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::print_features(vw *all,example *ec)

{
  __normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
  __last;
  bool bVar1;
  size_t sVar2;
  features_value_index_audit_iterator *this;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  element_type *__s;
  feature_value *pfVar3;
  reference psVar4;
  int __c;
  int __c_00;
  pointer in_RSI;
  features_value_iterator *rhs;
  pointer in_RDI;
  string_value *sv;
  iterator __end3;
  iterator __begin3;
  vector<GD::string_value,_std::allocator<GD::string_value>_> *__range3;
  iterator *f_1;
  iterator __end4_1;
  iterator __begin4_1;
  features *__range4_1;
  iterator_all *f;
  iterator_all __end4;
  iterator_all __begin4;
  features_value_index_audit_range *__range4;
  features *fs;
  iterator __end2;
  iterator __begin2;
  example *__range2;
  audit_results dat;
  uint64_t in_stack_000002c0;
  float in_stack_000002cc;
  audit_results *in_stack_000002d0;
  example_predict *in_stack_fffffffffffffe28;
  example_predict *in_stack_fffffffffffffe30;
  audit_results *this_01;
  undefined4 in_stack_fffffffffffffe38;
  feature_value in_stack_fffffffffffffe3c;
  __normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
  in_stack_fffffffffffffe40;
  features *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe58;
  feature_value in_stack_fffffffffffffe5c;
  audit_results *in_stack_fffffffffffffe60;
  __normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
  local_128;
  undefined1 *local_120;
  string_value *local_118;
  string_value *local_110;
  features_value_index_iterator *local_108;
  features_value_iterator local_100 [2];
  features_value_iterator local_f0;
  example *in_stack_ffffffffffffff18;
  vw *in_stack_ffffffffffffff20;
  features_value_iterator local_d0 [3];
  features_value_index_audit_iterator local_b8;
  features *local_a0;
  features **local_98;
  features *local_90;
  iterator local_88 [2];
  iterator local_68;
  pointer local_58;
  pointer local_10;
  pointer local_8;
  
  if (*(int *)((long)&in_RDI[0x1a3].field_2 + 8) == 0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    audit_results::audit_results
              ((audit_results *)in_stack_fffffffffffffe40._M_current,
               (vw *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (size_t)in_stack_fffffffffffffe30);
    local_58 = local_10;
    local_68 = example_predict::begin(in_stack_fffffffffffffe30);
    local_88[0] = example_predict::end(in_stack_fffffffffffffe30);
    while( true ) {
      bVar1 = example_predict::iterator::operator!=(&local_68,local_88);
      if (!bVar1) break;
      local_90 = example_predict::iterator::operator*(&local_68);
      sVar2 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(&local_90->space_names);
      if (sVar2 == 0) {
        features::begin(in_stack_fffffffffffffe48);
        features::end(in_stack_fffffffffffffe48);
        while( true ) {
          rhs = local_100;
          bVar1 = features_value_iterator::operator!=(&local_f0,rhs);
          in_stack_fffffffffffffe58 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe58);
          if (!bVar1) break;
          local_108 = features_value_index_iterator::operator*
                                ((features_value_index_iterator *)&local_f0);
          in_stack_fffffffffffffe48 =
               (features *)features_value_iterator::value(&local_108->super_features_value_iterator)
          ;
          in_stack_fffffffffffffe3c = *(feature_value *)&(in_stack_fffffffffffffe48->values)._begin;
          in_stack_fffffffffffffe40._M_current =
               (string_value *)features_value_index_iterator::index(local_108,(char *)rhs,__c_00);
          audit_feature(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
          features_value_index_iterator::operator++
                    ((features_value_index_iterator *)in_stack_fffffffffffffe30);
        }
      }
      else {
        local_a0 = (features *)features::values_indices_audit((features *)in_stack_fffffffffffffe28)
        ;
        local_98 = &local_a0;
        features::features_value_index_audit_range::begin
                  ((features_value_index_audit_range *)in_stack_fffffffffffffe48);
        features::features_value_index_audit_range::end
                  ((features_value_index_audit_range *)in_stack_fffffffffffffe48);
        while( true ) {
          bVar1 = features_value_iterator::operator!=((features_value_iterator *)&local_b8,local_d0)
          ;
          if (!bVar1) break;
          this = features_value_index_audit_iterator::operator*(&local_b8);
          this_00 = &features_value_index_audit_iterator::audit_abi_cxx11_(this)->
                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ;
          __s = std::
                __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ::get(this_00);
          audit_interaction(in_stack_fffffffffffffe60,
                            (audit_strings *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          pfVar3 = features_value_iterator::value((features_value_iterator *)this);
          in_stack_fffffffffffffe5c = *pfVar3;
          in_stack_fffffffffffffe60 =
               (audit_results *)
               features_value_index_iterator::index
                         (&this->super_features_value_index_iterator,(char *)__s,__c);
          audit_feature(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
          audit_interaction(in_stack_fffffffffffffe60,
                            (audit_strings *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          features_value_index_audit_iterator::operator++
                    ((features_value_index_audit_iterator *)in_stack_fffffffffffffe30);
        }
      }
      example_predict::iterator::operator++(&local_68);
    }
    INTERACTIONS::
    generate_interactions<GD::audit_results,_const_unsigned_long,_&GD::audit_feature,_true,_&GD::audit_interaction>
              ((vw *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(audit_results *)0x16a0b2);
    this_01 = (audit_results *)&stack0xffffffffffffffd8;
    local_110 = (string_value *)
                std::vector<GD::string_value,_std::allocator<GD::string_value>_>::begin
                          ((vector<GD::string_value,_std::allocator<GD::string_value>_> *)
                           in_stack_fffffffffffffe28);
    local_118 = (string_value *)
                std::vector<GD::string_value,_std::allocator<GD::string_value>_>::end
                          ((vector<GD::string_value,_std::allocator<GD::string_value>_> *)
                           in_stack_fffffffffffffe28);
    __last._M_current._4_4_ = in_stack_fffffffffffffe3c;
    __last._M_current._0_4_ = in_stack_fffffffffffffe38;
    std::
    stable_sort<__gnu_cxx::__normal_iterator<GD::string_value*,std::vector<GD::string_value,std::allocator<GD::string_value>>>>
              (in_stack_fffffffffffffe40,__last);
    if ((local_8[0x1a1].field_2._M_local_buf[8] & 1U) != 0) {
      local_120 = &stack0xffffffffffffffd8;
      local_128._M_current =
           (string_value *)
           std::vector<GD::string_value,_std::allocator<GD::string_value>_>::begin
                     ((vector<GD::string_value,_std::allocator<GD::string_value>_> *)
                      in_stack_fffffffffffffe28);
      std::vector<GD::string_value,_std::allocator<GD::string_value>_>::end
                ((vector<GD::string_value,_std::allocator<GD::string_value>_> *)
                 in_stack_fffffffffffffe28);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
                            *)this_01,
                           (__normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
                            *)in_stack_fffffffffffffe28);
        if (!bVar1) break;
        psVar4 = __gnu_cxx::
                 __normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
                 ::operator*(&local_128);
        in_stack_fffffffffffffe28 = (example_predict *)std::operator<<((ostream *)&std::cout,'\t');
        std::operator<<((ostream *)in_stack_fffffffffffffe28,(string *)&psVar4->s);
        __gnu_cxx::
        __normal_iterator<GD::string_value_*,_std::vector<GD::string_value,_std::allocator<GD::string_value>_>_>
        ::operator++(&local_128);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    audit_results::~audit_results(this_01);
  }
  else {
    print_lda_features(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  return;
}

Assistant:

void print_features(vw& all, example& ec)
{
  if (all.lda > 0)
    print_lda_features(all, ec);
  else
  {
    audit_results dat(all, ec.ft_offset);

    for (features& fs : ec)
    {
      if (fs.space_names.size() > 0)
        for (features::iterator_all& f : fs.values_indices_audit())
        {
          audit_interaction(dat, f.audit().get());
          audit_feature(dat, f.value(), f.index() + ec.ft_offset);
          audit_interaction(dat, NULL);
        }
      else
        for (features::iterator& f : fs) audit_feature(dat, f.value(), f.index() + ec.ft_offset);
    }

    INTERACTIONS::generate_interactions<audit_results, const uint64_t, audit_feature, true, audit_interaction>(
        all, ec, dat);

    stable_sort(dat.results.begin(), dat.results.end());
    if (all.audit)
    {
      for (string_value& sv : dat.results) cout << '\t' << sv.s;
      cout << endl;
    }
  }
}